

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O0

void nn_excl_term(nn_excl *self)

{
  nn_excl *self_local;
  
  if (self->pipe != (nn_pipe *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!self->pipe",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/utils/excl.c"
            ,0x26);
    fflush(_stderr);
    nn_err_abort();
  }
  if (self->inpipe != (nn_pipe *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!self->inpipe",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/utils/excl.c"
            ,0x27);
    fflush(_stderr);
    nn_err_abort();
  }
  if (self->outpipe != (nn_pipe *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!self->outpipe",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/utils/excl.c"
            ,0x28);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

void nn_excl_term (struct nn_excl *self)
{
    nn_assert (!self->pipe);
    nn_assert (!self->inpipe);
    nn_assert (!self->outpipe);
}